

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintCharsAsStringTo(char *begin,size_t len,ostream *os)

{
  byte bVar1;
  int iVar2;
  CharFormat CVar3;
  size_t sVar4;
  bool bVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  if (len != 0) {
    bVar5 = false;
    sVar4 = 0;
    do {
      bVar1 = begin[sVar4];
      if (bVar5) {
        iVar2 = isxdigit((uint)bVar1);
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\" \"",3);
        }
      }
      CVar3 = PrintAsWideStringLiteralTo((uint)bVar1,os);
      bVar5 = CVar3 == kHexEscape;
      sVar4 = sVar4 + 1;
    } while (len != sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  return;
}

Assistant:

static void PrintCharsAsStringTo(const char* begin, size_t len, ostream* os) {
  *os << "\"";
  bool is_previous_hex = false;
  for (size_t index = 0; index < len; ++index) {
    const char cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" \"";
    }
    is_previous_hex = PrintAsNarrowStringLiteralTo(cur, os) == kHexEscape;
  }
  *os << "\"";
}